

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_overlay.cpp
# Opt level: O0

void __thiscall r_exec::PGMOverlay::reset(PGMOverlay *this)

{
  EVP_PKEY_CTX *in_RSI;
  PGMOverlay *this_local;
  
  InputLessPGMOverlay::reset(&this->super_InputLessPGMOverlay);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::clear
            (&(this->super_InputLessPGMOverlay).super_Overlay.patch_indices);
  std::vector<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>::clear
            (&this->input_views);
  r_code::list<unsigned_short>::clear(&this->input_pattern_indices);
  init(this,in_RSI);
  return;
}

Assistant:

inline void PGMOverlay::reset()
{
    InputLessPGMOverlay::reset();
    patch_indices.clear();
    input_views.clear();
    input_pattern_indices.clear();
    init();
}